

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O3

REF_STATUS ref_interp_max_error(REF_INTERP ref_interp,REF_DBL *max_error)

{
  int iVar1;
  REF_MPI pRVar2;
  REF_NODE pRVar3;
  REF_NODE pRVar4;
  REF_CELL pRVar5;
  REF_GLOB *pRVar6;
  REF_INT *pRVar7;
  REF_DBL *pRVar8;
  REF_DBL *pRVar9;
  uint uVar10;
  void *pvVar11;
  void *send;
  void *pvVar12;
  REF_INT *proc;
  ulong uVar13;
  long lVar14;
  long lVar15;
  undefined8 uVar16;
  ulong uVar17;
  char *pcVar18;
  long lVar19;
  uint uVar20;
  size_t __size;
  double dVar21;
  REF_DBL RVar22;
  double dVar23;
  double dVar24;
  REF_INT n_donor;
  uint local_124;
  REF_MPI local_120;
  REF_INT *local_118;
  void *local_110;
  REF_INT *local_108;
  REF_INT *recept_node;
  REF_INT *donor_ret;
  REF_DBL *local_f0;
  REF_INT *donor_cell;
  REF_INT *donor_node;
  REF_DBL *donor_bary;
  REF_DBL *recept_xyz;
  REF_NODE local_c8;
  REF_CELL local_c0;
  REF_DBL *max_error_local;
  REF_DBL local_b0;
  REF_INT nodes [27];
  
  pRVar2 = ref_interp->ref_mpi;
  pRVar3 = ref_interp->to_grid->node;
  pRVar4 = ref_interp->from_grid->node;
  pRVar5 = (&ref_interp->from_tet)[ref_interp->from_grid->twod != 0];
  *max_error = 0.0;
  iVar1 = pRVar3->max;
  uVar17 = (ulong)iVar1;
  max_error_local = max_error;
  if ((long)uVar17 < 1) {
    uVar20 = 0;
  }
  else {
    uVar13 = 0;
    uVar20 = 0;
    do {
      if (((-1 < pRVar3->global[uVar13]) && (pRVar3->ref_mpi->id == pRVar3->part[uVar13])) &&
         (ref_interp->cell[uVar13] != -1)) {
        uVar20 = uVar20 + 1;
        local_124 = uVar20;
      }
      uVar13 = uVar13 + 1;
    } while (uVar17 != uVar13);
    if ((int)uVar20 < 0) {
      pcVar18 = "malloc recept_bary of REF_DBL negative";
      uVar16 = 0x956;
      goto LAB_0015300f;
    }
  }
  local_120 = pRVar2;
  local_c8 = pRVar4;
  local_c0 = pRVar5;
  pvVar11 = malloc((ulong)(uVar20 * 4) << 3);
  if (pvVar11 == (void *)0x0) {
    pcVar18 = "malloc recept_bary of REF_DBL NULL";
    uVar16 = 0x956;
  }
  else {
    __size = (ulong)uVar20 << 2;
    local_f0 = max_error;
    send = malloc(__size);
    if (send == (void *)0x0) {
      pcVar18 = "malloc recept_cell of REF_INT NULL";
      uVar16 = 0x957;
    }
    else {
      recept_node = (REF_INT *)malloc(__size);
      if (recept_node == (REF_INT *)0x0) {
        pcVar18 = "malloc recept_node of REF_INT NULL";
        uVar16 = 0x958;
      }
      else {
        local_108 = recept_node;
        pvVar12 = malloc(__size);
        if (pvVar12 == (void *)0x0) {
          pcVar18 = "malloc recept_ret of REF_INT NULL";
          uVar16 = 0x959;
        }
        else {
          local_110 = pvVar12;
          proc = (REF_INT *)malloc(__size);
          pRVar2 = local_120;
          if (proc != (REF_INT *)0x0) {
            local_124 = 0;
            if (iVar1 < 1) {
              uVar20 = 0;
            }
            else {
              pRVar6 = pRVar3->global;
              lVar14 = 0;
              uVar13 = 0;
              uVar20 = 0;
              do {
                if (((-1 < pRVar6[uVar13]) && (pRVar3->ref_mpi->id == pRVar3->part[uVar13])) &&
                   (pRVar7 = ref_interp->cell, pRVar7[uVar13] != -1)) {
                  pRVar8 = ref_interp->bary;
                  lVar19 = 0;
                  do {
                    *(undefined8 *)((long)pvVar11 + lVar19 * 8 + (long)(int)(uVar20 * 4) * 8) =
                         *(undefined8 *)((long)pRVar8 + lVar19 * 8 + lVar14);
                    lVar19 = lVar19 + 1;
                  } while (lVar19 != 4);
                  lVar19 = (long)(int)uVar20;
                  proc[lVar19] = ref_interp->part[uVar13];
                  *(REF_INT *)((long)send + lVar19 * 4) = pRVar7[uVar13];
                  local_108[lVar19] = (REF_INT)uVar13;
                  *(REF_INT *)((long)local_110 + lVar19 * 4) = local_120->id;
                  uVar20 = uVar20 + 1;
                  local_124 = uVar20;
                }
                uVar13 = uVar13 + 1;
                lVar14 = lVar14 + 0x20;
              } while (uVar13 < uVar17);
            }
            local_118 = proc;
            uVar10 = ref_mpi_blindsend(local_120,proc,send,1,uVar20,&donor_cell,&n_donor,1);
            if (uVar10 == 0) {
              uVar10 = ref_mpi_blindsend(pRVar2,local_118,local_110,1,uVar20,&donor_ret,&n_donor,1);
              if (uVar10 == 0) {
                uVar10 = ref_mpi_blindsend(pRVar2,local_118,local_108,1,uVar20,&donor_node,&n_donor,
                                           1);
                if (uVar10 == 0) {
                  uVar10 = ref_mpi_blindsend(pRVar2,local_118,pvVar11,4,uVar20,&donor_bary,&n_donor,
                                             3);
                  if (uVar10 == 0) {
                    free(local_118);
                    free(local_110);
                    free(local_108);
                    free(send);
                    free(pvVar11);
                    uVar17 = (ulong)(uint)n_donor;
                    if (n_donor < 0) {
                      pcVar18 = "malloc donor_xyz of REF_DBL negative";
                      uVar16 = 0x97d;
LAB_0015300f:
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                             ,uVar16,"ref_interp_max_error",pcVar18);
                      return 1;
                    }
                    pvVar11 = malloc(uVar17 * 0x18);
                    pRVar5 = local_c0;
                    if (pvVar11 == (void *)0x0) {
                      pcVar18 = "malloc donor_xyz of REF_DBL NULL";
                      uVar16 = 0x97d;
                      goto LAB_0015321b;
                    }
                    if (uVar17 != 0) {
                      lVar14 = 0;
                      do {
                        uVar10 = ref_cell_nodes(pRVar5,donor_cell[lVar14],nodes);
                        if (uVar10 != 0) {
                          pcVar18 = "node needs to be localized";
                          uVar16 = 0x981;
                          goto LAB_00153395;
                        }
                        uVar20 = pRVar5->node_per;
                        lVar19 = 0;
                        do {
                          *(undefined8 *)((long)pvVar11 + lVar19 * 8 + lVar14 * 0x18) = 0;
                          if (0 < (int)uVar20) {
                            pRVar8 = local_c8->real;
                            dVar21 = 0.0;
                            uVar17 = 0;
                            do {
                              dVar21 = dVar21 + donor_bary
                                                [(ulong)((uint)lVar14 & 0x3fffffff) * 4 + uVar17] *
                                                pRVar8[(long)nodes[uVar17] * 0xf + (long)(int)lVar19
                                                      ];
                              *(double *)((long)pvVar11 + lVar19 * 8 + lVar14 * 0x18) = dVar21;
                              uVar17 = uVar17 + 1;
                            } while (uVar20 != uVar17);
                          }
                          lVar19 = lVar19 + 1;
                        } while (lVar19 != 3);
                        lVar14 = lVar14 + 1;
                      } while (lVar14 < n_donor);
                    }
                    if (donor_cell != (REF_INT *)0x0) {
                      free(donor_cell);
                    }
                    if (donor_bary != (REF_DBL *)0x0) {
                      free(donor_bary);
                    }
                    pRVar2 = local_120;
                    uVar10 = ref_mpi_blindsend(local_120,donor_ret,pvVar11,3,n_donor,&recept_xyz,
                                               (REF_INT *)&local_124,3);
                    if (uVar10 == 0) {
                      uVar10 = ref_mpi_blindsend(pRVar2,donor_ret,donor_node,1,n_donor,&recept_node,
                                                 (REF_INT *)&local_124,1);
                      if (uVar10 == 0) {
                        free(pvVar11);
                        if (donor_node != (REF_INT *)0x0) {
                          free(donor_node);
                        }
                        if (donor_ret != (REF_INT *)0x0) {
                          free(donor_ret);
                        }
                        pRVar8 = local_f0;
                        if (0 < (int)local_124) {
                          RVar22 = *local_f0;
                          lVar14 = 4;
                          lVar19 = 0;
                          uVar20 = local_124;
                          do {
                            lVar15 = (long)recept_node[lVar19];
                            pRVar9 = pRVar3->real;
                            dVar24 = *(double *)((long)recept_xyz + lVar14 * 4 + -8) -
                                     pRVar9[lVar15 * 0xf + 1];
                            dVar21 = *(double *)((long)recept_xyz + lVar14 * 4 + -0x10) -
                                     pRVar9[lVar15 * 0xf];
                            dVar23 = *(double *)((long)recept_xyz + lVar14 * 4) -
                                     pRVar9[lVar15 * 0xf + 2];
                            dVar21 = dVar23 * dVar23 + dVar24 * dVar24 + dVar21 * dVar21;
                            if ((RVar22 <= SQRT(dVar21)) &&
                               (RVar22 = SQRT(dVar21), uVar20 = local_124, dVar21 < 0.0)) {
                              RVar22 = sqrt(dVar21);
                              uVar20 = local_124;
                            }
                            *pRVar8 = RVar22;
                            lVar19 = lVar19 + 1;
                            lVar14 = lVar14 + 6;
                          } while (lVar19 < (int)uVar20);
                        }
                        if (recept_node != (REF_INT *)0x0) {
                          free(recept_node);
                        }
                        if (recept_xyz != (REF_DBL *)0x0) {
                          free(recept_xyz);
                        }
                        local_b0 = *local_f0;
                        uVar10 = ref_mpi_max(local_120,&local_b0,local_f0,3);
                        if (uVar10 == 0) {
                          uVar10 = ref_mpi_bcast(local_120,&max_error_local,1,3);
                          if (uVar10 == 0) {
                            return 0;
                          }
                          pcVar18 = "max";
                          uVar16 = 0x9a4;
                        }
                        else {
                          pcVar18 = "max";
                          uVar16 = 0x9a3;
                        }
                      }
                      else {
                        pcVar18 = "blind send node";
                        uVar16 = 0x992;
                      }
                    }
                    else {
                      pcVar18 = "blind send bary";
                      uVar16 = 0x98f;
                    }
                  }
                  else {
                    pcVar18 = "blind send bary";
                    uVar16 = 0x975;
                  }
                }
                else {
                  pcVar18 = "blind send node";
                  uVar16 = 0x972;
                }
              }
              else {
                pcVar18 = "blind send ret";
                uVar16 = 0x96f;
              }
            }
            else {
              pcVar18 = "blind send cell";
              uVar16 = 0x96c;
            }
LAB_00153395:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,uVar16,"ref_interp_max_error",(ulong)uVar10,pcVar18);
            return uVar10;
          }
          pcVar18 = "malloc recept_proc of REF_INT NULL";
          uVar16 = 0x95a;
        }
      }
    }
  }
LAB_0015321b:
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar16,
         "ref_interp_max_error",pcVar18);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_interp_max_error(REF_INTERP ref_interp,
                                        REF_DBL *max_error) {
  REF_GRID from_grid = ref_interp_from_grid(ref_interp);
  REF_GRID to_grid = ref_interp_to_grid(ref_interp);
  REF_MPI ref_mpi = ref_interp_mpi(ref_interp);
  REF_NODE to_node = ref_grid_node(to_grid);
  REF_CELL from_cell;
  REF_NODE from_node = ref_grid_node(from_grid);
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node;
  REF_DBL error;
  REF_INT i, j;
  REF_INT receptor, n_recept, donation, n_donor;
  REF_DBL *recept_xyz, *donor_xyz, *recept_bary, *donor_bary;
  REF_INT *donor_node, *donor_ret, *donor_cell;
  REF_INT *recept_proc, *recept_ret, *recept_node, *recept_cell;

  if (ref_grid_twod(from_grid)) {
    from_cell = ref_interp_from_tri(ref_interp);
  } else {
    from_cell = ref_interp_from_tet(ref_interp);
  }

  *max_error = 0.0;

  n_recept = 0;
  each_ref_node_valid_node(to_node, node) {
    if (ref_node_owned(to_node, node) && REF_EMPTY != ref_interp->cell[node]) {
      n_recept++;
    }
  }

  ref_malloc(recept_bary, 4 * n_recept, REF_DBL);
  ref_malloc(recept_cell, n_recept, REF_INT);
  ref_malloc(recept_node, n_recept, REF_INT);
  ref_malloc(recept_ret, n_recept, REF_INT);
  ref_malloc(recept_proc, n_recept, REF_INT);

  n_recept = 0;
  each_ref_node_valid_node(to_node, node) {
    if (ref_node_owned(to_node, node) && REF_EMPTY != ref_interp->cell[node]) {
      for (i = 0; i < 4; i++) {
        recept_bary[i + 4 * n_recept] = ref_interp->bary[i + 4 * node];
      }
      recept_proc[n_recept] = ref_interp->part[node];
      recept_cell[n_recept] = ref_interp->cell[node];
      recept_node[n_recept] = node;
      recept_ret[n_recept] = ref_mpi_rank(ref_mpi);
      n_recept++;
    }
  }

  RSS(ref_mpi_blindsend(ref_mpi, recept_proc, (void *)recept_cell, 1, n_recept,
                        (void **)(&donor_cell), &n_donor, REF_INT_TYPE),
      "blind send cell");
  RSS(ref_mpi_blindsend(ref_mpi, recept_proc, (void *)recept_ret, 1, n_recept,
                        (void **)(&donor_ret), &n_donor, REF_INT_TYPE),
      "blind send ret");
  RSS(ref_mpi_blindsend(ref_mpi, recept_proc, (void *)recept_node, 1, n_recept,
                        (void **)(&donor_node), &n_donor, REF_INT_TYPE),
      "blind send node");
  RSS(ref_mpi_blindsend(ref_mpi, recept_proc, (void *)recept_bary, 4, n_recept,
                        (void **)(&donor_bary), &n_donor, REF_DBL_TYPE),
      "blind send bary");

  ref_free(recept_proc);
  ref_free(recept_ret);
  ref_free(recept_node);
  ref_free(recept_cell);
  ref_free(recept_bary);

  ref_malloc(donor_xyz, 3 * n_donor, REF_DBL);

  for (donation = 0; donation < n_donor; donation++) {
    RSS(ref_cell_nodes(from_cell, donor_cell[donation], nodes),
        "node needs to be localized");
    for (i = 0; i < 3; i++) {
      donor_xyz[i + 3 * donation] = 0.0;
      for (j = 0; j < ref_cell_node_per(from_cell); j++) {
        donor_xyz[i + 3 * donation] +=
            donor_bary[j + 4 * donation] * ref_node_xyz(from_node, i, nodes[j]);
      }
    }
  }
  ref_free(donor_cell);
  ref_free(donor_bary);

  RSS(ref_mpi_blindsend(ref_mpi, donor_ret, (void *)donor_xyz, 3, n_donor,
                        (void **)(&recept_xyz), &n_recept, REF_DBL_TYPE),
      "blind send bary");
  RSS(ref_mpi_blindsend(ref_mpi, donor_ret, (void *)donor_node, 1, n_donor,
                        (void **)(&recept_node), &n_recept, REF_INT_TYPE),
      "blind send node");
  ref_free(donor_xyz);
  ref_free(donor_node);
  ref_free(donor_ret);

  for (receptor = 0; receptor < n_recept; receptor++) {
    node = recept_node[receptor];
    error =
        pow(recept_xyz[0 + 3 * receptor] - ref_node_xyz(to_node, 0, node), 2) +
        pow(recept_xyz[1 + 3 * receptor] - ref_node_xyz(to_node, 1, node), 2) +
        pow(recept_xyz[2 + 3 * receptor] - ref_node_xyz(to_node, 2, node), 2);
    *max_error = MAX(*max_error, sqrt(error));
  }
  ref_free(recept_node);
  ref_free(recept_xyz);

  error = *max_error;
  RSS(ref_mpi_max(ref_mpi, &error, max_error, REF_DBL_TYPE), "max");
  RSS(ref_mpi_bcast(ref_mpi, &max_error, 1, REF_DBL_TYPE), "max");

  return REF_SUCCESS;
}